

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,uint32_t result_id
          )

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar1;
  size_t sVar2;
  SPIRType *type;
  mapped_type *pmVar3;
  size_type sVar4;
  SPIRBlock *pSVar5;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar6;
  char (*pacVar7) [4];
  long lVar8;
  string *this_01;
  long lVar9;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar10;
  uint32_t result_id_local;
  uint32_t result_type_local;
  key_type local_78 [8];
  char *local_58;
  string local_50 [32];
  
  result_id_local = result_id;
  result_type_local = result_type;
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  local_78[0].id = result_id;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,local_78);
  if (this->current_continue_block == (SPIRBlock *)0x0) {
LAB_00217a60:
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&result_id_local);
    if (sVar4 == 0) {
      add_local_variable_name(this,result_id_local);
      local_58 = flags_to_qualifiers_glsl(this,type,&(pmVar3->decoration).decoration_flags);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)result_id_local,1);
      pacVar7 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_78,this,type,local_50);
      join<char_const*,std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)&local_58,(char **)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31e8c7,
                 pacVar7);
      ::std::__cxx11::string::~string((string *)local_78);
      this_01 = local_50;
      goto LAB_00217c34;
    }
    pacVar7 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_78,this,(ulong)result_id_local)
    ;
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31e8c7,pacVar7
              );
  }
  else {
    this_00 = &(this->super_Compiler).hoisted_temporaries;
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,&result_id_local);
    if (sVar4 != 0) goto LAB_00217a60;
    pSVar5 = Compiler::get<spirv_cross::SPIRBlock>
                       (&this->super_Compiler,(this->current_continue_block->loop_dominator).id);
    ppVar1 = (pSVar5->declare_temporary).
             super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
             .ptr;
    sVar2 = (pSVar5->declare_temporary).
            super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
            .buffer_size;
    ppVar6 = ppVar1 + 2;
    lVar8 = sVar2 << 3;
    for (lVar9 = (long)sVar2 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
      if ((ppVar6[-2].first.id == result_type) && (ppVar6[-2].second.id == result_id_local)) {
        ppVar10 = ppVar6 + -2;
        goto LAB_00217bdb;
      }
      if ((ppVar6[-1].first.id == result_type) && (ppVar6[-1].second.id == result_id_local)) {
        ppVar10 = ppVar6 + -1;
        goto LAB_00217bdb;
      }
      if (((ppVar6->first).id == result_type) &&
         (ppVar10 = ppVar6, (ppVar6->second).id == result_id_local)) goto LAB_00217bdb;
      if ((ppVar6[1].first.id == result_type) && (ppVar6[1].second.id == result_id_local)) {
        ppVar10 = ppVar6 + 1;
        goto LAB_00217bdb;
      }
      ppVar6 = ppVar6 + 4;
      lVar8 = lVar8 + -0x20;
    }
    lVar8 = lVar8 >> 3;
    ppVar10 = ppVar6 + -2;
    if (lVar8 == 1) {
LAB_00217c6f:
      if (((ppVar10->first).id == result_type) && ((ppVar10->second).id == result_id_local))
      goto LAB_00217bdb;
LAB_00217be0:
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
      ::emplace_back<unsigned_int&,unsigned_int&>
                ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  *)&pSVar5->declare_temporary,&result_type_local,&result_id_local);
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this_00,&result_id_local);
      Compiler::force_recompile(&this->super_Compiler);
    }
    else {
      if (lVar8 == 3) {
        if ((ppVar6[-2].first.id != result_type) || (ppVar6[-2].second.id != result_id_local)) {
          ppVar10 = ppVar6 + -1;
          goto LAB_00217c5c;
        }
      }
      else {
        if (lVar8 != 2) goto LAB_00217be0;
LAB_00217c5c:
        if (((ppVar10->first).id != result_type) || ((ppVar10->second).id != result_id_local)) {
          ppVar10 = ppVar10 + 1;
          goto LAB_00217c6f;
        }
      }
LAB_00217bdb:
      if (ppVar10 == ppVar1 + sVar2) goto LAB_00217be0;
    }
    pacVar7 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_78,this,(ulong)result_id_local)
    ;
    join<std::__cxx11::string,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31e8c7,pacVar7
              );
  }
  this_01 = (string *)local_78;
LAB_00217c34:
  ::std::__cxx11::string::~string(this_01);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);
	auto &flags = ir.meta[result_id].decoration.decoration_flags;

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}